

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void * stumpless_sqlite3_prepare(stumpless_entry *entry,void *data,size_t *count)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  strbuilder *builder;
  strbuilder *psVar11;
  char *pcVar12;
  size_t buffer_size;
  char timestamp [33];
  size_t local_70;
  int local_68;
  int local_64;
  size_t *local_60;
  char local_58 [40];
  
  local_70 = gmtime_r_get_now(local_58);
  puVar1 = (undefined8 *)((long)data + 0x20);
  if (*(long *)((long)data + 0x20) == 0) {
    iVar3 = sqlite3_prepare_v2(*data,*(undefined8 *)((long)data + 8),0xffffffff,puVar1,0);
    if (iVar3 != 0) {
      raise_sqlite3_failure("sqlite3_prepare_v2 failed",iVar3);
      return (void *)0x0;
    }
  }
  else {
    sqlite3_reset();
  }
  builder = strbuilder_new();
  if (builder == (strbuilder *)0x0) {
    return (void *)0x0;
  }
  uVar2 = *puVar1;
  local_60 = count;
  iVar3 = sqlite3_bind_parameter_index(uVar2,"$prival");
  iVar4 = sqlite3_bind_parameter_index(uVar2,"$facility");
  iVar5 = sqlite3_bind_parameter_index(uVar2,"$severity");
  local_64 = sqlite3_bind_parameter_index(uVar2,"$timestamp");
  iVar6 = sqlite3_bind_parameter_index(uVar2,"$hostname");
  iVar7 = sqlite3_bind_parameter_index(uVar2,"$app_name");
  iVar8 = sqlite3_bind_parameter_index(uVar2,"$procid");
  iVar9 = sqlite3_bind_parameter_index(uVar2,"$msgid");
  iVar10 = sqlite3_bind_parameter_index(uVar2,"$structured_data");
  local_68 = sqlite3_bind_parameter_index(uVar2,"$message");
  lock_entry(entry);
  if ((iVar3 == 0) || (iVar3 = sqlite3_bind_int(uVar2,iVar3,entry->prival), iVar3 == 0)) {
    if (iVar4 != 0) {
      iVar3 = get_facility(entry->prival);
      iVar3 = sqlite3_bind_int(uVar2,iVar4,iVar3);
      if (iVar3 != 0) {
        pcVar12 = "could not bind $facility to the statement";
        goto LAB_0011343a;
      }
    }
    if (iVar5 != 0) {
      iVar3 = get_severity(entry->prival);
      iVar3 = sqlite3_bind_int(uVar2,iVar5,iVar3);
      if (iVar3 != 0) {
        pcVar12 = "could not bind $severity to the statement";
        goto LAB_0011343a;
      }
    }
    iVar3 = local_64;
    if (local_64 != 0) {
      if ((local_70 == 1) && (local_58[0] == '-')) {
        iVar3 = sqlite3_bind_null(uVar2,local_64);
      }
      else {
        iVar4 = cap_size_t_to_int(local_70);
        iVar3 = sqlite3_bind_text(uVar2,iVar3,local_58,iVar4,0xffffffffffffffff);
      }
      if (iVar3 != 0) {
        pcVar12 = "could not bind $timestamp to the statement";
        goto LAB_0011343a;
      }
    }
    if (iVar6 != 0) {
      psVar11 = strbuilder_append_hostname(builder);
      if (psVar11 == (strbuilder *)0x0) goto LAB_00113441;
      pcVar12 = strbuilder_get_buffer(builder,&local_70);
      if ((local_70 == 1) && (*pcVar12 == '-')) {
        iVar3 = sqlite3_bind_null(uVar2,iVar6);
      }
      else {
        iVar3 = cap_size_t_to_int(local_70);
        iVar3 = sqlite3_bind_text(uVar2,iVar6,pcVar12,iVar3,0xffffffffffffffff);
      }
      if (iVar3 != 0) {
        pcVar12 = "could not bind $hostname to the statement";
        goto LAB_0011343a;
      }
    }
    if (iVar7 != 0) {
      if ((entry->app_name_length == 1) && (entry->app_name[0] == '-')) {
        iVar3 = sqlite3_bind_null(uVar2,iVar7);
      }
      else {
        iVar3 = cap_size_t_to_int(entry->app_name_length);
        iVar3 = sqlite3_bind_text(uVar2,iVar7,entry->app_name,iVar3,0);
      }
      if (iVar3 != 0) {
        pcVar12 = "could not bind $app_name to the statement";
        goto LAB_0011343a;
      }
    }
    if (iVar8 != 0) {
      strbuilder_reset(builder);
      psVar11 = strbuilder_append_procid(builder);
      if (psVar11 == (strbuilder *)0x0) goto LAB_00113441;
      pcVar12 = strbuilder_get_buffer(builder,&local_70);
      if ((local_70 == 1) && (*pcVar12 == '-')) {
        iVar3 = sqlite3_bind_null(uVar2,iVar8);
      }
      else {
        iVar3 = cap_size_t_to_int(local_70);
        iVar3 = sqlite3_bind_text(uVar2,iVar8,pcVar12,iVar3,0xffffffffffffffff);
      }
      if (iVar3 != 0) {
        pcVar12 = "could not bind $procid to the statement";
        goto LAB_0011343a;
      }
    }
    if (iVar9 != 0) {
      if ((entry->msgid_length == 1) && (entry->msgid[0] == '-')) {
        iVar3 = sqlite3_bind_null(uVar2,iVar9);
      }
      else {
        iVar3 = cap_size_t_to_int(entry->msgid_length);
        iVar3 = sqlite3_bind_text(uVar2,iVar9,entry->msgid,iVar3,0);
      }
      if (iVar3 != 0) {
        pcVar12 = "could not bind $msgid to the statement";
        goto LAB_0011343a;
      }
    }
    if (iVar10 != 0) {
      strbuilder_reset(builder);
      psVar11 = strbuilder_append_structured_data(builder,entry);
      if (psVar11 == (strbuilder *)0x0) goto LAB_00113441;
      pcVar12 = strbuilder_get_buffer(builder,&local_70);
      if ((local_70 == 1) && (*pcVar12 == '-')) {
        iVar3 = sqlite3_bind_null(uVar2,iVar10);
      }
      else {
        iVar3 = cap_size_t_to_int(local_70);
        iVar3 = sqlite3_bind_text(uVar2,iVar10,pcVar12,iVar3,0xffffffffffffffff);
      }
      if (iVar3 != 0) {
        pcVar12 = "could not bind $structured_data to the statement";
        goto LAB_0011343a;
      }
    }
    iVar3 = local_68;
    if (local_68 == 0) {
LAB_0011373a:
      unlock_entry(entry);
      strbuilder_destroy(builder);
      *local_60 = 1;
      return puVar1;
    }
    if (entry->message == (char *)0x0) {
      iVar3 = sqlite3_bind_null(uVar2,local_68);
    }
    else {
      iVar4 = cap_size_t_to_int(entry->message_length);
      iVar3 = sqlite3_bind_text(uVar2,iVar3,entry->message,iVar4,0);
    }
    if (iVar3 == 0) goto LAB_0011373a;
    pcVar12 = "could not bind $message to the statement";
  }
  else {
    pcVar12 = "could not bind $prival to the statement";
  }
LAB_0011343a:
  raise_sqlite3_failure(pcVar12,iVar3);
LAB_00113441:
  unlock_entry(entry);
  strbuilder_destroy(builder);
  return (void *)0x0;
}

Assistant:

void *
stumpless_sqlite3_prepare( const struct stumpless_entry *entry,
                           void *data,
                           size_t *count ) {
  struct sqlite3_target *target;
  int sql_result;
  int length;
  sqlite3_stmt *insert_stmt;
  int prival_index;
  int facility_index;
  int severity_index;
  int timestamp_index;
  int hostname_index;
  int app_name_index;
  int procid_index;
  int msgid_index;
  int structured_data_index;
  int message_index;
  char timestamp[RFC_5424_TIMESTAMP_BUFFER_SIZE];
  struct strbuilder *builder;
  const struct strbuilder *strbuilder_result;
  const char *buffer;
  size_t buffer_size;
  const char *msg;

  buffer_size = config_get_now( timestamp );

  target = data;
  if( !target->insert_stmts[0] ) {
    sql_result = sqlite3_prepare_v2( target->db,
                                     target->insert_sql,
                                     -1,
                                     &target->insert_stmts[0],
                                     NULL );
    if( sql_result != SQLITE_OK ) {
      raise_sqlite3_failure( L10N_SQLITE3_PREPARE_FAILED_ERROR_MESSAGE,
                             sql_result );
      return NULL;
    }
  } else {
    sqlite3_reset( target->insert_stmts[0] );
  }

  builder = strbuilder_new();
  if( !builder ) {
    return NULL;
  }

  insert_stmt = target->insert_stmts[0];

  // we can gather the indexes before we need to lock the entry
  prival_index = sqlite3_bind_parameter_index( insert_stmt, "$prival" );
  facility_index = sqlite3_bind_parameter_index( insert_stmt, "$facility" );
  severity_index = sqlite3_bind_parameter_index( insert_stmt, "$severity" );
  timestamp_index = sqlite3_bind_parameter_index( insert_stmt, "$timestamp" );
  hostname_index = sqlite3_bind_parameter_index( insert_stmt, "$hostname" );
  app_name_index = sqlite3_bind_parameter_index( insert_stmt, "$app_name" );
  procid_index = sqlite3_bind_parameter_index( insert_stmt, "$procid" );
  msgid_index = sqlite3_bind_parameter_index( insert_stmt, "$msgid" );
  structured_data_index = sqlite3_bind_parameter_index( insert_stmt,
                                                        "$structured_data" );
  message_index = sqlite3_bind_parameter_index( insert_stmt, "$message" );

  lock_entry( entry );

  if( prival_index != 0 ) {
    sql_result = sqlite3_bind_int( insert_stmt, prival_index, entry->prival );
    if( sql_result != SQLITE_OK ) {
      msg = L10N_SQLITE3_BIND_FAILED_ERROR_MESSAGE( "$prival" );
      goto fail_bind;
    }
  }

  if( facility_index != 0 ) {
    sql_result = sqlite3_bind_int( insert_stmt,
                                   facility_index,
                                   get_facility( entry->prival ) );
    if( sql_result != SQLITE_OK ) {
      msg = L10N_SQLITE3_BIND_FAILED_ERROR_MESSAGE( "$facility" );
      goto fail_bind;
    }
  }

  if( severity_index != 0 ) {
    sql_result = sqlite3_bind_int( insert_stmt,
                                   severity_index,
                                   get_severity( entry->prival ) );
    if( sql_result != SQLITE_OK ) {
      msg = L10N_SQLITE3_BIND_FAILED_ERROR_MESSAGE( "$severity" );
      goto fail_bind;
    }
  }

  if( timestamp_index != 0 ) {
    if( buffer_size == 1 && timestamp[0] == '-'  ) {
      sql_result = sqlite3_bind_null( insert_stmt, timestamp_index );
    } else {
      // transient since it lives on the stack for this function, which will
      // disappear before the step occurs
      sql_result = sqlite3_bind_text( insert_stmt,
                                      timestamp_index,
                                      timestamp,
                                      cap_size_t_to_int( buffer_size ),
                                      SQLITE_TRANSIENT );
    }
    if( sql_result != SQLITE_OK ) {
      msg = L10N_SQLITE3_BIND_FAILED_ERROR_MESSAGE( "$timestamp" );
      goto fail_bind;
    }
  }

  if( hostname_index != 0 ) {
    strbuilder_result = strbuilder_append_hostname( builder );
    if( !strbuilder_result ) {
      goto fail;
    }
    buffer = strbuilder_get_buffer( builder, &buffer_size );
    if( buffer_size == 1 && buffer[0] == '-' ) {
      sql_result = sqlite3_bind_null( insert_stmt, hostname_index );
    } else {
      // transient since we reuse and destroy this strbuilder before the
      // statement is executed
      sql_result = sqlite3_bind_text( insert_stmt,
                                      hostname_index,
                                      buffer,
                                      cap_size_t_to_int( buffer_size ),
                                      SQLITE_TRANSIENT );
    }
    if( sql_result != SQLITE_OK ) {
      msg = L10N_SQLITE3_BIND_FAILED_ERROR_MESSAGE( "$hostname" );
      goto fail_bind;
    }
  }

  if( app_name_index != 0 ) {
    if( entry->app_name_length == 1 && entry->app_name[0] == '-' ) {
      sql_result = sqlite3_bind_null( insert_stmt, app_name_index );
    } else {
      length = cap_size_t_to_int( entry->app_name_length );
      sql_result = sqlite3_bind_text( insert_stmt,
                                      app_name_index,
                                      entry->app_name,
                                      length,
                                      SQLITE_STATIC );
    }
    if( sql_result != SQLITE_OK ) {
      msg = L10N_SQLITE3_BIND_FAILED_ERROR_MESSAGE( "$app_name" );
      goto fail_bind;
    }
  }

  if( procid_index != 0 ) {
    strbuilder_reset( builder );
    strbuilder_result = strbuilder_append_procid( builder );
    if( !strbuilder_result ) {
      goto fail;
    }
    buffer = strbuilder_get_buffer( builder, &buffer_size );
    if( buffer_size == 1 && buffer[0] == '-' ) {
      sql_result = sqlite3_bind_null( insert_stmt, procid_index );
    } else {
      // transient since we reuse and destroy this strbuilder before the
      // statement is executed
      sql_result = sqlite3_bind_text( insert_stmt,
                                      procid_index,
                                      buffer,
                                      cap_size_t_to_int( buffer_size ),
                                      SQLITE_TRANSIENT );
    }
    if( sql_result != SQLITE_OK ) {
      msg = L10N_SQLITE3_BIND_FAILED_ERROR_MESSAGE( "$procid" );
      goto fail_bind;
    }
  }

  if( msgid_index != 0 ) {
    if( entry->msgid_length == 1 && entry->msgid[0] == '-' ) {
      sql_result = sqlite3_bind_null( insert_stmt, msgid_index );
    } else {
      length = cap_size_t_to_int( entry->msgid_length );
      sql_result = sqlite3_bind_text( insert_stmt,
                                      msgid_index,
                                      entry->msgid,
                                      length,
                                      SQLITE_STATIC );
    }
    if( sql_result != SQLITE_OK ) {
      msg = L10N_SQLITE3_BIND_FAILED_ERROR_MESSAGE( "$msgid" );
      goto fail_bind;
    }
  }

  if( structured_data_index != 0 ) {
    strbuilder_reset( builder );
    strbuilder_result = strbuilder_append_structured_data( builder, entry );
    if( !strbuilder_result ) {
      goto fail;
    }
    buffer = strbuilder_get_buffer( builder, &buffer_size );
    if( buffer_size == 1 && buffer[0] == '-' ) {
      sql_result = sqlite3_bind_null( insert_stmt, structured_data_index );
    } else {
      // transient since we reuse and destroy this strbuilder before the
      // statement is executed
      sql_result = sqlite3_bind_text( insert_stmt,
                                      structured_data_index,
                                      buffer,
                                      cap_size_t_to_int( buffer_size ),
                                      SQLITE_TRANSIENT );
    }
    if( sql_result != SQLITE_OK ) {
      msg = L10N_SQLITE3_BIND_FAILED_ERROR_MESSAGE( "$structured_data" );
      goto fail_bind;
    }
  }

  if( message_index != 0 ) {
    if( entry->message ) {
      length = cap_size_t_to_int( entry->message_length );
      sql_result = sqlite3_bind_text( insert_stmt,
                                      message_index,
                                      entry->message,
                                      length,
                                      SQLITE_STATIC );
    } else {
      sql_result = sqlite3_bind_null( insert_stmt, message_index );
    }
    if( sql_result != SQLITE_OK ) {
      msg = L10N_SQLITE3_BIND_FAILED_ERROR_MESSAGE( "$message" );
      goto fail_bind;
    }
  }

  unlock_entry( entry );
  strbuilder_destroy( builder );

  *count = 1;
  return &target->insert_stmts;

fail_bind:
  raise_sqlite3_failure( msg, sql_result );
fail:
  unlock_entry( entry );
  strbuilder_destroy( builder );
  return NULL;
}